

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

char * CVmObjString::cvt_to_str
                 (vm_val_t *new_str,char *result_buf,size_t result_buf_size,vm_val_t *val,int radix,
                 int flags)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined4 extraout_var;
  char *buflen;
  vm_val_t *in_RCX;
  ulong buf_size;
  size_t in_RDX;
  char *in_RSI;
  vm_val_t *in_RDI;
  uint in_R8D;
  uint in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  vm_val_t *in_stack_00000008;
  vm_val_t *in_stack_00000010;
  size_t in_stack_ffffffffffffffc0;
  char *local_8;
  
  vm_val_t::set_nil(in_RDI);
  buf_size = (ulong)(in_RCX->typ - VM_NIL);
  switch(buf_size) {
  case 0:
    local_8 = "\x03";
    break;
  case 1:
    local_8 = "\x04";
    break;
  default:
    err_throw(0);
  case 4:
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0x2d])
                      (pCVar2,(ulong)(in_RCX->val).obj,in_RDI,(ulong)in_R8D,(ulong)in_R9D);
    local_8 = (char *)CONCAT44(extraout_var,iVar1);
    break;
  case 5:
    local_8 = reflect_to_str(in_RDI,in_RSI,in_RDX,in_RCX,"property#%d",(ulong)(in_RCX->val).prop);
    break;
  case 6:
    buflen = alloc_str_buf(in_RCX,(char *)CONCAT44(in_R8D,in_R9D),buf_size,in_stack_ffffffffffffffc0
                          );
    local_8 = cvt_int_to_str((char *)in_RDI,(size_t)buflen,(int32_t)(in_RDX >> 0x20),(int)in_RDX,
                             (int)((ulong)in_RCX >> 0x20));
    break;
  case 7:
    local_8 = CVmPoolInMem::get_ptr((CVmPoolInMem *)CONCAT44(in_R8D,in_R9D),0);
    break;
  case 9:
    local_8 = CVmObjList::list_to_string
                        (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    break;
  case 0xb:
    local_8 = reflect_to_str(in_RDI,in_RSI,in_RDX,in_RCX,"function#%lx",(ulong)(in_RCX->val).obj);
    break;
  case 0xe:
    local_8 = reflect_to_str(in_RDI,in_RSI,in_RDX,in_RCX,"enum#%ld",(ulong)(in_RCX->val).obj);
    break;
  case 0xf:
    local_8 = reflect_to_str(in_RDI,in_RSI,in_RDX,in_RCX,"builtin#%d.%d",(ulong)(in_RCX->val).prop,
                             (uint)(in_RCX->val).bifptr.func_idx);
  }
  return local_8;
}

Assistant:

const char *CVmObjString::cvt_to_str(VMG_ vm_val_t *new_str,
                                     char *result_buf,
                                     size_t result_buf_size,
                                     const vm_val_t *val,
                                     int radix, int flags)
{
    /* presume we won't need to create a new string object */
    new_str->set_nil();
    
    /* check the type of the value */
    switch(val->typ)
    {
    case VM_SSTRING:
        /* it's a string constant - no conversion is necessary */
        return G_const_pool->get_ptr(val->val.ofs);

    case VM_OBJ:
        /* it's an object - ask it for its string representation */
        return vm_objp(vmg_ val->val.obj)->explicit_to_string(
            vmg_ val->val.obj, new_str, radix, flags);

    case VM_INT:
        /* 
         *   It's a number - convert it to a string.  Use the provided result
         *   buffer if possible, but make sure we have room for the number.
         *   The unicode values we're storing are in the ascii range, so we
         *   only need one byte per character.  The longest buffer we'd need,
         *   then, is 33 bytes, for a conversion to a bit string (i.e., base
         *   2: 32 1s or 0s, plus a sign).  The conversion also needs two
         *   bytes for the length prefix; add a few extra bytes as insurance
         *   against future algorithm changes that might need more padding.  
         */
        result_buf = alloc_str_buf(vmg_ new_str,
                                   result_buf, result_buf_size, 40);

        /* generate the string */
        return cvt_int_to_str(result_buf, 40, val->val.intval, radix, flags);

    case VM_NIL:
        /* nil - use the literal string "nil" */
        return "\003\000nil";

    case VM_TRUE:
        /* true - use the literal string "true" */
        return "\004\000true";

    case VM_LIST:
        return CVmObjList::list_to_string(vmg_ new_str, val, radix, flags);

    case VM_PROP:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "property#%d", (int)val->val.prop);

    case VM_FUNCPTR:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "function#%lx", (long)val->val.ofs);

    case VM_ENUM:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "enum#%ld", (long)val->val.enumval);

    case VM_BIFPTR:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "builtin#%d.%d",
                              (int)val->val.bifptr.set_idx,
                              (int)val->val.bifptr.func_idx);

    default:
        /* other types cannot be added to a string */
        err_throw(VMERR_NO_STR_CONV);

        /* we never really get here, but the compiler doesn't know that */
        AFTER_ERR_THROW(return 0;)
    }
}